

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O2

void update_statusline_aux(wchar_t row,wchar_t col)

{
  int iVar1;
  long lVar2;
  
  prt("",row,col);
  for (lVar2 = 0; lVar2 != 0x68; lVar2 = lVar2 + 8) {
    iVar1 = (**(code **)((long)status_handlers + lVar2))(row,col);
    col = iVar1 + col;
  }
  return;
}

Assistant:

static void update_statusline_aux(int row, int col)
{
	size_t i;

	/* Clear the remainder of the line */
	prt("", row, col);

	/* Display those which need redrawing */
	for (i = 0; i < N_ELEMENTS(status_handlers); i++)
		col += status_handlers[i](row, col);
}